

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Data<QHashPrivate::Node<QString,_QByteArray>_> *
QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::detached
          (Data<QHashPrivate::Node<QString,_QByteArray>_> *d)

{
  bool bVar1;
  void *in_RDI;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *dd;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffffe0;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)operator_new(0x28);
    Data(local_8,in_stack_ffffffffffffffc8);
  }
  else {
    local_8 = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)operator_new(0x28);
    Data(local_8,in_stack_ffffffffffffffc0);
    bVar1 = QtPrivate::RefCount::deref(&local_8->ref);
    if ((!bVar1) && (in_RDI != (void *)0x0)) {
      ~Data(in_stack_ffffffffffffffe0);
      operator_delete(in_RDI,0x28);
    }
  }
  return local_8;
}

Assistant:

static Data *detached(Data *d)
    {
        if (!d)
            return new Data;
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        return dd;
    }